

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O1

void __thiscall QPlainTextEdit::QPlainTextEdit(QPlainTextEdit *this,QString *text,QWidget *parent)

{
  QAbstractScrollAreaPrivate *this_00;
  
  this_00 = (QAbstractScrollAreaPrivate *)operator_new(0x360);
  QAbstractScrollAreaPrivate::QAbstractScrollAreaPrivate(this_00);
  *(undefined ***)&(this_00->super_QFramePrivate).super_QWidgetPrivate =
       &PTR__QPlainTextEditPrivate_0080aa88;
  *(undefined4 *)&this_00[1].super_QFramePrivate.super_QWidgetPrivate = 0;
  *(undefined4 *)&this_00[1].super_QFramePrivate.super_QWidgetPrivate.field_0x4 = 0;
  *(undefined4 *)&this_00[1].super_QFramePrivate.super_QWidgetPrivate.field_0x8 = 0;
  *(undefined8 *)&this_00[1].super_QFramePrivate.super_QWidgetPrivate.field_0x10 = 0;
  *(undefined8 *)&this_00[1].super_QFramePrivate.super_QWidgetPrivate.field_0x18 = 0;
  *(undefined8 *)&this_00[1].super_QFramePrivate.super_QWidgetPrivate.field_0x20 = 0;
  *(undefined8 *)&this_00[1].super_QFramePrivate.super_QWidgetPrivate.field_0x28 = 0;
  *(undefined8 *)&this_00[1].super_QFramePrivate.super_QWidgetPrivate.field_0x30 = 0;
  *(undefined8 *)&this_00[1].super_QFramePrivate.super_QWidgetPrivate.field_0x38 = 0;
  *(undefined8 *)&this_00[1].super_QFramePrivate.super_QWidgetPrivate.field_0x40 = 0x400000001;
  *(undefined8 *)&this_00[1].super_QFramePrivate.super_QWidgetPrivate.field_0x58 = 0;
  *(undefined8 *)&this_00[1].super_QFramePrivate.super_QWidgetPrivate.field_0x60 = 0;
  *(undefined8 *)&this_00[1].super_QFramePrivate.super_QWidgetPrivate.field_0x48 = 0;
  this_00[1].super_QFramePrivate.super_QWidgetPrivate.field_0x50 = 0;
  QAbstractScrollArea::QAbstractScrollArea((QAbstractScrollArea *)this,this_00,parent);
  *(undefined ***)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget =
       &PTR_metaObject_0080a560;
  *(undefined ***)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.super_QPaintDevice =
       &PTR__QPlainTextEdit_0080a760;
  QPlainTextEditPrivate::init
            (*(QPlainTextEditPrivate **)
              &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8,
             (EVP_PKEY_CTX *)text);
  return;
}

Assistant:

QPlainTextEdit::QPlainTextEdit(const QString &text, QWidget *parent)
    : QAbstractScrollArea(*new QPlainTextEditPrivate, parent)
{
    Q_D(QPlainTextEdit);
    d->init(text);
}